

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  long *in_RAX;
  size_t sVar1;
  pointer *__ptr;
  ostream *poVar2;
  char *__s;
  long *local_28;
  
  local_28 = in_RAX;
  testing::Message::Message((Message *)&local_28);
  __s = *value;
  poVar2 = (ostream *)(local_28 + 2);
  if (__s == (char *)0x0) {
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  AppendMessage(this,(Message *)&local_28);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }